

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ConfigError * CLI::ConfigError::Extras(string *item)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000018;
  ConfigError *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = in_RDI;
  ::std::operator+((char *)in_RDI,in_RSI);
  ConfigError(in_stack_00000020,in_stack_00000018);
  ::std::__cxx11::string::~string(this);
  return (ConfigError *)in_RDI;
}

Assistant:

static ConfigError Extras(std::string item) { return ConfigError("INI was not able to parse " + item); }